

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O2

void __thiscall
cmLocalUnixMakefileGenerator3::WriteSpecialTargetsBottom
          (cmLocalUnixMakefileGenerator3 *this,ostream *makefileStream)

{
  cmGlobalGenerator *this_00;
  cmake *this_01;
  bool bVar1;
  ostream *poVar2;
  string *psVar3;
  string *relDir;
  allocator<char> local_b9;
  string runRule;
  string cmakefileName;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands;
  string local_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  no_depends;
  
  WriteDivider(this,makefileStream);
  poVar2 = std::operator<<(makefileStream,"# Special targets to cleanup operation of make.\n");
  std::operator<<(poVar2,"\n");
  this_00 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmakefileName,"CMAKE_SUPPRESS_REGENERATION",(allocator<char> *)&runRule);
  bVar1 = cmGlobalGenerator::GlobalSettingIsOn(this_00,&cmakefileName);
  std::__cxx11::string::~string((string *)&cmakefileName);
  if (!bVar1) {
    commands.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    commands.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    commands.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    this_01 = ((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator)->
              CMakeInstance;
    bVar1 = cmake::DoWriteGlobVerifyTarget(this_01);
    if (bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&cmakefileName,"$(CMAKE_COMMAND) -P ",(allocator<char> *)&runRule);
      psVar3 = cmake::GetGlobVerifyScript_abi_cxx11_(this_01);
      cmOutputConverter::ConvertToOutputFormat
                (&runRule,&(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                           super_cmOutputConverter,psVar3,SHELL);
      std::__cxx11::string::append((string *)&cmakefileName);
      std::__cxx11::string::~string((string *)&runRule);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&commands,&cmakefileName);
      std::__cxx11::string::~string((string *)&cmakefileName);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmakefileName,"CMakeFiles/",(allocator<char> *)&runRule);
    std::__cxx11::string::append((char *)&cmakefileName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&runRule,"$(CMAKE_COMMAND) -S$(CMAKE_SOURCE_DIR) -B$(CMAKE_BINARY_DIR)",
               (allocator<char> *)&local_58);
    std::__cxx11::string::append((char *)&runRule);
    cmOutputConverter::ConvertToOutputFormat
              (&local_58,
               &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter,
               &cmakefileName,SHELL);
    std::__cxx11::string::append((string *)&runRule);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::append((char *)&runRule);
    no_depends.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    no_depends.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    no_depends.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&commands,
               &runRule);
    bVar1 = cmLocalGenerator::IsRootMakefile((cmLocalGenerator *)this);
    if (!bVar1) {
      psVar3 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
      relDir = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
      CreateCDCommand(this,&commands,psVar3,relDir);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"cmake_check_build_system",&local_b9);
    WriteMakeRule(this,makefileStream,
                  "Special rule to run CMake to check the build system integrity.\nNo rule that depends on this can have commands that come from listfiles\nbecause they might be regenerated."
                  ,&local_58,&no_depends,&commands,true,false);
    std::__cxx11::string::~string((string *)&local_58);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&no_depends);
    std::__cxx11::string::~string((string *)&runRule);
    std::__cxx11::string::~string((string *)&cmakefileName);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&commands);
  }
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::WriteSpecialTargetsBottom(
  std::ostream& makefileStream)
{
  this->WriteDivider(makefileStream);
  makefileStream << "# Special targets to cleanup operation of make.\n"
                 << "\n";

  // Write special "cmake_check_build_system" target to run cmake with
  // the --check-build-system flag.
  if (!this->GlobalGenerator->GlobalSettingIsOn(
        "CMAKE_SUPPRESS_REGENERATION")) {
    // Build command to run CMake to check if anything needs regenerating.
    std::vector<std::string> commands;
    cmake* cm = this->GlobalGenerator->GetCMakeInstance();
    if (cm->DoWriteGlobVerifyTarget()) {
      std::string rescanRule = "$(CMAKE_COMMAND) -P ";
      rescanRule += this->ConvertToOutputFormat(cm->GetGlobVerifyScript(),
                                                cmOutputConverter::SHELL);
      commands.push_back(rescanRule);
    }
    std::string cmakefileName = "CMakeFiles/";
    cmakefileName += "Makefile.cmake";
    std::string runRule =
      "$(CMAKE_COMMAND) -S$(CMAKE_SOURCE_DIR) -B$(CMAKE_BINARY_DIR)";
    runRule += " --check-build-system ";
    runRule +=
      this->ConvertToOutputFormat(cmakefileName, cmOutputConverter::SHELL);
    runRule += " 0";

    std::vector<std::string> no_depends;
    commands.push_back(std::move(runRule));
    if (!this->IsRootMakefile()) {
      this->CreateCDCommand(commands, this->GetBinaryDirectory(),
                            this->GetCurrentBinaryDirectory());
    }
    this->WriteMakeRule(makefileStream,
                        "Special rule to run CMake to check the build system "
                        "integrity.\n"
                        "No rule that depends on this can have "
                        "commands that come from listfiles\n"
                        "because they might be regenerated.",
                        "cmake_check_build_system", no_depends, commands,
                        true);
  }
}